

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_reader_tests.cpp
# Opt level: O0

void check_parse_cbor(vector<unsigned_char,_std::allocator<unsigned_char>_> *v,json *expected)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  type_conflict9 tVar1;
  bool bVar2;
  semantic_tag sVar3;
  semantic_tag sVar4;
  byte *pbVar5;
  ostream *this;
  void *this_00;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  reference puVar7;
  undefined1 *__nbytes;
  void *__buf;
  undefined8 in_RDI;
  exception *e;
  AssertionHandler catchAssertionHandler_2;
  json j2;
  istringstream is;
  uchar c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  string s;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  uchar b;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  json result;
  cbor_bytes_reader reader;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  error_code ec;
  undefined4 in_stack_fffffffffffff848;
  Flags in_stack_fffffffffffff84c;
  basic_cbor_reader<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_fffffffffffff850;
  StringRef *in_stack_fffffffffffff858;
  AssertionHandler *in_stack_fffffffffffff860;
  cbor_decode_options *in_stack_fffffffffffff868;
  SourceLineInfo *this_01;
  undefined7 in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff877;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff878;
  undefined7 in_stack_fffffffffffff880;
  undefined1 in_stack_fffffffffffff887;
  ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffff888;
  SourceLineInfo *this_02;
  temp_allocator_type *in_stack_fffffffffffff8a0;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffff8a8;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_fffffffffffff8b0;
  SourceLineInfo local_698;
  StringRef local_688;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffff9b8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffff9c0;
  istringstream local_608 [391];
  uchar local_481;
  uchar *local_480;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_478;
  undefined8 local_470;
  string local_468 [37];
  semantic_tag local_443;
  semantic_tag local_442;
  semantic_tag *local_440;
  SourceLineInfo local_3f8;
  StringRef local_3e8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_388;
  cbor_decode_options *in_stack_fffffffffffffca0;
  istream *in_stack_fffffffffffffca8;
  SourceLineInfo local_340;
  StringRef local_330;
  byte local_2d1;
  uchar *local_2d0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2c8;
  undefined8 local_2c0;
  allocator<char> local_2a1;
  undefined1 local_2a0 [24];
  basic_cbor_reader<jsoncons::bytes_source,_std::allocator<char>_> local_288;
  allocator<char> local_a2;
  allocator<char> local_a1 [129];
  undefined1 local_20 [24];
  undefined8 local_8;
  
  local_8 = in_RDI;
  std::error_code::error_code((error_code *)in_stack_fffffffffffff850);
  std::allocator<char>::allocator();
  std::allocator<char>::allocator();
  jsoncons::
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(in_stack_fffffffffffff8b0,(allocator_type *)in_stack_fffffffffffff8a8,
                 in_stack_fffffffffffff8a0);
  std::allocator<char>::~allocator(&local_a2);
  std::allocator<char>::~allocator(local_a1);
  jsoncons::cbor::cbor_decode_options::cbor_decode_options
            ((cbor_decode_options *)in_stack_fffffffffffff850);
  std::allocator<char>::allocator();
  __nbytes = local_2a0;
  jsoncons::cbor::basic_cbor_reader<jsoncons::bytes_source,std::allocator<char>>::
  basic_cbor_reader<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
            ((basic_cbor_reader<jsoncons::bytes_source,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),in_stack_fffffffffffff878
             ,(json_visitor *)CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870),
             in_stack_fffffffffffff868,(allocator<char> *)in_stack_fffffffffffff860);
  std::allocator<char>::~allocator(&local_2a1);
  jsoncons::cbor::cbor_decode_options::~cbor_decode_options
            ((cbor_decode_options *)in_stack_fffffffffffff850);
  jsoncons::cbor::basic_cbor_reader<jsoncons::bytes_source,_std::allocator<char>_>::read
            (&local_288,(int)local_20,__buf,(size_t)__nbytes);
  jsoncons::
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result(in_stack_fffffffffffff8a8);
  tVar1 = jsoncons::operator==
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffff850,
                     (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  if (!tVar1) {
    std::operator<<((ostream *)&std::cout,"v: ");
    local_2c0 = local_8;
    local_2c8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
    local_2d0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffff850,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
      if (!bVar2) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_2c8);
      local_2d1 = *pbVar5;
      this = std::operator<<((ostream *)&std::cout,"0x");
      this_00 = (void *)std::ostream::operator<<(this,std::hex);
      std::ostream::operator<<(this_00,(uint)local_2d1);
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_2c8);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"result: ");
    pbVar6 = jsoncons::operator<<(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    std::operator<<(pbVar6,"\n");
    std::operator<<((ostream *)&std::cout,"expected: ");
    pbVar6 = jsoncons::operator<<(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    std::operator<<(pbVar6,"\n");
  }
  local_330 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff850,
                         CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_340,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/cbor_reader_tests.cpp"
             ,0x2f);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
  capturedExpression.m_size._0_7_ = in_stack_fffffffffffff870;
  capturedExpression.m_start = (char *)in_stack_fffffffffffff868;
  capturedExpression.m_size._7_1_ = in_stack_fffffffffffff877;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,
             (SourceLineInfo *)in_stack_fffffffffffff850,capturedExpression,
             in_stack_fffffffffffff84c);
  local_388 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848)
                         ,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          0x325352);
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==(in_stack_fffffffffffff888,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff850,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  Catch::
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *)0x3253a9);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff850);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff850);
  local_3e8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff850,
                         CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  this_02 = &local_3f8;
  Catch::SourceLineInfo::SourceLineInfo
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/cbor_reader_tests.cpp"
             ,0x30);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
  capturedExpression_00.m_size._0_7_ = in_stack_fffffffffffff870;
  capturedExpression_00.m_start = (char *)in_stack_fffffffffffff868;
  capturedExpression_00.m_size._7_1_ = in_stack_fffffffffffff877;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,
             (SourceLineInfo *)in_stack_fffffffffffff850,capturedExpression_00,
             in_stack_fffffffffffff84c);
  sVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffff858);
  local_442 = sVar3;
  local_440 = (semantic_tag *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848)
                         ,(semantic_tag *)0x3254df);
  sVar4 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffff858);
  local_443 = sVar4;
  Catch::ExprLhs<jsoncons::semantic_tag_const&>::operator==
            ((ExprLhs<const_jsoncons::semantic_tag_&> *)this_02,
             (semantic_tag *)CONCAT17(sVar3,in_stack_fffffffffffff880));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff850,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  Catch::BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&>::~BinaryExpr
            ((BinaryExpr<const_jsoncons::semantic_tag_&,_const_jsoncons::semantic_tag_&> *)0x325554)
  ;
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff850);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff850);
  std::__cxx11::string::string(local_468);
  local_470 = local_8;
  local_478._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  local_480 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_fffffffffffff850,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
    if (!bVar2) break;
    puVar7 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_478);
    local_481 = *puVar7;
    std::__cxx11::string::push_back((char)local_468);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_478);
  }
  std::__cxx11::istringstream::istringstream(local_608,local_468,_S_in);
  jsoncons::cbor::cbor_decode_options::cbor_decode_options
            ((cbor_decode_options *)in_stack_fffffffffffff850);
  jsoncons::cbor::
  decode_cbor<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  jsoncons::cbor::cbor_decode_options::~cbor_decode_options
            ((cbor_decode_options *)in_stack_fffffffffffff850);
  local_688 = operator____catch_sr
                        ((char *)in_stack_fffffffffffff850,
                         CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  this_01 = &local_698;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/cbor_reader_tests.cpp"
             ,0x39);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
  capturedExpression_01.m_size._0_7_ = in_stack_fffffffffffff870;
  capturedExpression_01.m_start = (char *)this_01;
  capturedExpression_01.m_size._7_1_ = sVar4;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,
             (SourceLineInfo *)in_stack_fffffffffffff850,capturedExpression_01,
             in_stack_fffffffffffff84c);
  Catch::Decomposer::operator<=
            ((Decomposer *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x32580a);
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==((ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)this_02,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             CONCAT17(sVar3,in_stack_fffffffffffff880));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffff850,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  Catch::
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *)0x325861);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff850);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff850);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x325945);
  std::__cxx11::istringstream::~istringstream(local_608);
  std::__cxx11::string::~string(local_468);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x32596c);
  jsoncons::cbor::basic_cbor_reader<jsoncons::bytes_source,_std::allocator<char>_>::
  ~basic_cbor_reader(in_stack_fffffffffffff850);
  jsoncons::
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::~json_decoder((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                   *)in_stack_fffffffffffff850);
  return;
}

Assistant:

void check_parse_cbor(const std::vector<uint8_t>& v, const json& expected)
{
    JSONCONS_TRY
    {
        std::error_code ec;

        jsoncons::json_decoder<json> decoder;
        cbor_bytes_reader reader(v, decoder);
        reader.read(ec);

        json result = decoder.get_result();

        if (!(result == expected))
        {
            std::cout << "v: ";
            for (auto b : v)
            {
                std::cout << "0x" << std::hex << (int)b;
            }
            std::cout << "\n";
            std::cout << "result: " << result << "\n";
            std::cout << "expected: " << expected << "\n";
        }

        REQUIRE(result == expected);
        CHECK(result.tag() == expected.tag());

        std::string s;
        for (auto c : v)
        {
            s.push_back(c);
        }
        std::istringstream is(s);
        json j2 = decode_cbor<json>(is);
        REQUIRE(j2 == expected);
    }